

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

void feat_agc(feat_t *fcb,mfcc_t **mfc,int32 nfr,int32 beginutt,int32 endutt)

{
  agc_type_t local_28;
  agc_type_t agc_type;
  int32 endutt_local;
  int32 beginutt_local;
  int32 nfr_local;
  mfcc_t **mfc_local;
  feat_t *fcb_local;
  
  local_28 = fcb->agc;
  if (((beginutt == 0) || (endutt == 0)) && (local_28 != AGC_NONE)) {
    local_28 = AGC_EMAX;
  }
  if (local_28 == AGC_MAX) {
    agc_max(fcb->agc_struct,mfc,nfr);
  }
  else if (local_28 == AGC_EMAX) {
    agc_emax(fcb->agc_struct,mfc,nfr);
    if (endutt != 0) {
      agc_emax_update(fcb->agc_struct);
    }
  }
  else if (local_28 == AGC_NOISE) {
    agc_noise(fcb->agc_struct,mfc,nfr);
  }
  return;
}

Assistant:

static void
feat_agc(feat_t *fcb, mfcc_t **mfc, int32 nfr, int32 beginutt, int32 endutt)
{
    agc_type_t agc_type = fcb->agc;

    if (!(beginutt && endutt)
        && agc_type != AGC_NONE) /* Only agc_emax in block computation mode. */
        agc_type = AGC_EMAX;

    switch (agc_type) {
    case AGC_MAX:
        agc_max(fcb->agc_struct, mfc, nfr);
        break;
    case AGC_EMAX:
        agc_emax(fcb->agc_struct, mfc, nfr);
        if (endutt)
            agc_emax_update(fcb->agc_struct);
        break;
    case AGC_NOISE:
        agc_noise(fcb->agc_struct, mfc, nfr);
        break;
    default:
        ;
    }
    cep_dump_dbg(fcb, mfc, nfr, "After AGC");
}